

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O1

void * rw::destroySkin(void *object,int32 offset,int32 param_3)

{
  long lVar1;
  
  lVar1 = *(long *)((long)object + (long)offset);
  if (lVar1 != 0) {
    (*DAT_00149de0)(*(undefined8 *)(lVar1 + 0x58));
    (*DAT_00149de0)(*(undefined8 *)(lVar1 + 0x40));
  }
  (*DAT_00149de0)(lVar1);
  return object;
}

Assistant:

static void*
destroySkin(void *object, int32 offset, int32)
{
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	if(skin){
		rwFree(skin->data);
		rwFree(skin->remapIndices);
//		delete[] skin->platformData;
	}
	rwFree(skin);
	return object;
}